

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t get_nfd(uint32_t *cp1,uint32_t *cp2,uint32_t uc)

{
  int iVar1;
  wchar_t m;
  wchar_t b;
  wchar_t t;
  uint32_t uc_local;
  uint32_t *cp2_local;
  uint32_t *cp1_local;
  
  if ((((uc < 0x2000) || (0x2fff < uc)) && ((uc < 0xf900 || (0xfaff < uc)))) &&
     ((((uc < 0x2f800 || (0x2faff < uc)) && (uc != 0x1109a)) && ((uc != 0x1109c && (uc != 0x110ab)))
      ))) {
    t = L'\0';
    b = L'΢';
    while (t <= b) {
      iVar1 = (t + b) / 2;
      if (u_decomposition_table[iVar1].nfc < uc) {
        t = iVar1 + L'\x01';
      }
      else {
        if (u_decomposition_table[iVar1].nfc <= uc) {
          *cp1 = u_decomposition_table[iVar1].cp1;
          *cp2 = u_decomposition_table[iVar1].cp2;
          return L'\x01';
        }
        b = iVar1 + L'\xffffffff';
      }
    }
  }
  return L'\0';
}

Assistant:

static int
get_nfd(uint32_t *cp1, uint32_t *cp2, uint32_t uc)
{
	int t, b;

	/*
	 * These are not converted to NFD on Mac OS.
	 */
	if ((uc >= 0x2000 && uc <= 0x2FFF) ||
	    (uc >= 0xF900 && uc <= 0xFAFF) ||
	    (uc >= 0x2F800 && uc <= 0x2FAFF))
		return (0);
	/*
	 * Those code points are not converted to NFD on Mac OS.
	 * I do not know the reason because it is undocumented.
	 *   NFC        NFD
	 *   1109A  ==> 11099 110BA
	 *   1109C  ==> 1109B 110BA
	 *   110AB  ==> 110A5 110BA
	 */
	if (uc == 0x1109A || uc == 0x1109C || uc == 0x110AB)
		return (0);

	t = 0;
	b = sizeof(u_decomposition_table)/sizeof(u_decomposition_table[0]) -1;
	while (b >= t) {
		int m = (t + b) / 2;
		if (u_decomposition_table[m].nfc < uc)
			t = m + 1;
		else if (u_decomposition_table[m].nfc > uc)
			b = m - 1;
		else {
			*cp1 = u_decomposition_table[m].cp1;
			*cp2 = u_decomposition_table[m].cp2;
			return (1);
		}
	}
	return (0);
}